

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait_strategy.h
# Opt level: O3

int64_t __thiscall
disruptor::SleepingStrategy<200l,std::chrono::duration<long,std::ratio<1l,1000l>>,1>::
WaitFor<long,std::ratio<1l,1l>>
          (SleepingStrategy<200l,std::chrono::duration<long,std::ratio<1l,1000l>>,1> *this,
          int64_t *sequence,Sequence *cursor,
          vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *dependents,
          atomic<bool> *alerted,duration<long,_std::ratio<1L,_1L>_> *timeout)

{
  long lVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  int *piVar5;
  long lVar6;
  bool bVar7;
  function<long_()> min_sequence;
  Sequence *local_60;
  undefined8 local_58;
  code *local_50;
  code *local_48;
  timespec local_40;
  
  lVar3 = std::chrono::_V2::system_clock::now();
  lVar1 = timeout->__r;
  bVar7 = (dependents->
          super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>)._M_impl
          .super__Vector_impl_data._M_finish !=
          (dependents->
          super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>)._M_impl
          .super__Vector_impl_data._M_start;
  local_58 = 0;
  if (bVar7) {
    cursor = (Sequence *)dependents;
  }
  local_48 = std::
             _Function_handler<long_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/disruptor/wait_strategy.h:383:12)>
             ::_M_invoke;
  if (!bVar7) {
    local_48 = std::
               _Function_handler<long_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/disruptor/wait_strategy.h:381:12)>
               ::_M_invoke;
  }
  local_50 = std::
             _Function_handler<long_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/disruptor/wait_strategy.h:383:12)>
             ::_M_manager;
  if (!bVar7) {
    local_50 = std::
               _Function_handler<long_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/disruptor/wait_strategy.h:381:12)>
               ::_M_manager;
  }
  lVar6 = 200;
  local_60 = cursor;
  do {
    lVar4 = (*local_48)(&local_60);
    if (*sequence <= lVar4) goto LAB_00114894;
    if (((alerted->_M_base)._M_i & 1U) != 0) goto LAB_00114884;
    if (lVar6 < 0x65) {
      if (lVar6 < 1) {
        local_40.tv_sec = 0;
        local_40.tv_nsec = 1000000;
        do {
          iVar2 = nanosleep(&local_40,&local_40);
          if (iVar2 != -1) break;
          piVar5 = __errno_location();
        } while (*piVar5 == 4);
      }
      else {
        lVar6 = lVar6 + -1;
        sched_yield();
      }
    }
    else {
      lVar6 = lVar6 + -1;
    }
    lVar4 = std::chrono::_V2::system_clock::now();
    if (lVar1 * 1000000000 + lVar3 <= lVar4) {
      lVar4 = -3;
      goto LAB_00114894;
    }
  } while (local_50 != (code *)0x0);
  std::__throw_bad_function_call();
LAB_00114884:
  lVar4 = -2;
LAB_00114894:
  if (local_50 != (code *)0x0) {
    (*local_50)(&local_60,&local_60,3);
  }
  return lVar4;
}

Assistant:

int64_t WaitFor(const int64_t& sequence, const Sequence& cursor,
                  const std::vector<Sequence*>& dependents,
                  const std::atomic<bool>& alerted,
                  const std::chrono::duration<R, P>& timeout) {
    int64_t available_sequence = kInitialCursorValue;
    int64_t counter = S;

    const auto start = std::chrono::system_clock::now();
    const auto stop = start + timeout;
    const auto min_sequence = buildMinSequenceFunction(cursor, dependents);

    while ((available_sequence = min_sequence()) < sequence) {
      if (alerted.load()) return kAlertedSignal;

      counter = ApplyWaitMethod(counter);

      if (stop <= std::chrono::system_clock::now()) return kTimeoutSignal;
    }

    return available_sequence;
  }